

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void addCommandDefinition(CommandInfo *comm)

{
  int iVar1;
  _Elt_pointer ppCVar2;
  ulong uVar3;
  _Elt_pointer ppCVar4;
  ulong uVar5;
  int iVar6;
  CommandInfo *in_RDI;
  _Map_pointer pppCVar7;
  _Elt_pointer ppCVar8;
  _Elt_pointer ppCVar9;
  int local_40;
  int local_3c;
  CommandInfo *local_38;
  
  ppCVar2 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  pppCVar7 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppCVar8 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_last;
  ppCVar9 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
  if (Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur !=
      Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    do {
      iVar1 = (*ppCVar9)->number;
      if ((iVar1 == in_RDI->number) && ((*ppCVar9)->isbuiltin == in_RDI->isbuiltin)) {
        iVar6 = (int)((ulong)((long)Commands._deque.
                                    super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_last -
                             (long)Commands._deque.
                                   super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
                (int)((ulong)((long)Commands._deque.
                                    super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                             (long)Commands._deque.
                                   super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
                ((((uint)((int)Commands._deque.
                               super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node -
                         (int)Commands._deque.
                              super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (uint)(Commands._deque.
                       super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x40;
        local_40 = iVar1;
        if (iVar6 <= iVar1) {
          local_3c = iVar6;
          error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                         ,&local_40,&local_3c);
        }
        uVar3 = ((long)Commands._deque.
                       super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur -
                 (long)Commands._deque.
                       super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 3) + (long)local_40;
        if ((long)uVar3 < 0) {
          uVar5 = (long)uVar3 >> 6;
LAB_001134db:
          ppCVar4 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x40;
        }
        else {
          if (0x3f < uVar3) {
            uVar5 = uVar3 >> 6;
            goto LAB_001134db;
          }
          ppCVar4 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur + local_40;
        }
        error<String,String>
                  ("Attempted to redefine command #%1 (%2) as %3",&(*ppCVar4)->name,&in_RDI->name);
      }
      ppCVar9 = ppCVar9 + 1;
      if (ppCVar9 == ppCVar8) {
        ppCVar9 = pppCVar7[1];
        pppCVar7 = pppCVar7 + 1;
        ppCVar8 = ppCVar9 + 0x40;
      }
    } while (ppCVar9 != ppCVar2);
  }
  if (Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<CommandInfo*,std::allocator<CommandInfo*>>::_M_push_back_aux<CommandInfo*const&>
              ((deque<CommandInfo*,std::allocator<CommandInfo*>> *)&Commands,&local_38);
  }
  else {
    *Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
     super__Deque_impl_data._M_finish._M_cur = in_RDI;
    Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur =
         Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur + 1;
  }
  return;
}

Assistant:

void addCommandDefinition (CommandInfo* comm)
{
	// Ensure that there is no conflicts
	for (CommandInfo* it : Commands)
	{
		if (it->number == comm->number && it->isbuiltin == comm->isbuiltin)
		{
			error ("Attempted to redefine command #%1 (%2) as %3",
				   Commands[comm->number]->name, comm->name);
		}
	}

	Commands << comm;
}